

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

int __thiscall CCNR::ls_solver::pick_var(ls_solver *this)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  reference piVar7;
  reference pvVar8;
  ls_solver *plVar9;
  undefined1 *puVar10;
  reference this_00;
  reference pvVar11;
  long in_RDI;
  int cp_lits_sz;
  clause *cp;
  int v_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int best_var;
  int v;
  int c;
  int k;
  size_t i;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  longlong lVar12;
  Mersenne *in_stack_ffffffffffffff40;
  ls_solver *in_stack_ffffffffffffff80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  long local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  ls_solver *local_18;
  int local_4;
  
  local_28 = 0;
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 200));
  if (sVar5 == 0) {
    if ((*(byte *)(in_RDI + 0xb0c) & 1) != 0) {
      *(undefined4 *)(in_RDI + 0xb10) = *(undefined4 *)(in_RDI + 0xb20);
      local_18 = (ls_solver *)0x0;
      while (in_stack_ffffffffffffff80 = local_18,
            plVar9 = (ls_solver *)
                     std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98)),
            in_stack_ffffffffffffff80 < plVar9) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(size_type)local_18
                           );
        local_24 = *pvVar6;
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_24);
        if ((long)*(int *)(in_RDI + 0xb10) < pvVar8->score) {
          local_28 = local_24;
          break;
        }
        local_18 = (ls_solver *)&local_18->field_0x1;
      }
      while( true ) {
        local_18 = (ls_solver *)&local_18->field_0x1;
        plVar9 = local_18;
        puVar10 = (undefined1 *)
                  std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98));
        if (puVar10 <= plVar9) break;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(size_type)local_18
                           );
        local_24 = *pvVar6;
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_24);
        lVar1 = pvVar8->score;
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_28);
        if (pvVar8->score < lVar1) {
          local_28 = local_24;
        }
        else {
          pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),(long)local_24);
          lVar1 = pvVar8->score;
          pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),(long)local_28);
          if (lVar1 == pvVar8->score) {
            pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                               ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                                (in_RDI + 0x20),(long)local_24);
            lVar1 = pvVar8->last_flip_step;
            pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                               ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                                (in_RDI + 0x20),(long)local_28);
            if (lVar1 < pvVar8->last_flip_step) {
              local_28 = local_24;
            }
          }
        }
      }
      if (local_28 != 0) {
        return local_28;
      }
    }
    iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    update_clause_weights(in_stack_ffffffffffffff80);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68));
    iVar4 = Mersenne::next(in_stack_ffffffffffffff40,iVar4);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)iVar4);
    local_20 = *pvVar6;
    this_00 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                        ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                         (long)local_20);
    pvVar11 = std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::operator[](&this_00->literals,0);
    local_28 = (int)pvVar11->var_num;
    sVar5 = std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::size(&this_00->literals);
    for (local_1c = 1; local_1c < (int)sVar5; local_1c = local_1c + 1) {
      pvVar11 = std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::operator[]
                          (&this_00->literals,(long)local_1c);
      local_24 = (int)pvVar11->var_num;
      pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,(long)local_24);
      lVar1 = pvVar8->score;
      pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,(long)local_28);
      if (pvVar8->score < lVar1) {
        local_28 = local_24;
      }
      else {
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_24);
        lVar12 = pvVar8->score;
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_28);
        if (lVar12 == pvVar8->score) {
          pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),(long)local_24);
          lVar12 = pvVar8->last_flip_step;
          pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),(long)local_28);
          if (lVar12 < pvVar8->last_flip_step) {
            local_28 = local_24;
          }
        }
      }
    }
    local_4 = local_28;
  }
  else {
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 200));
    *(size_type *)(in_RDI + 0x128) = sVar5 + *(long *)(in_RDI + 0x128);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),0);
    local_28 = *pvVar6;
    local_30 = in_RDI + 200;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff40,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff38), bVar3) {
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      iVar4 = *piVar7;
      pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,(long)iVar4);
      lVar1 = pvVar8->score;
      pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,(long)local_28);
      iVar2 = iVar4;
      if (lVar1 <= pvVar8->score) {
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)iVar4);
        lVar1 = pvVar8->score;
        pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_28);
        iVar2 = local_28;
        if (lVar1 == pvVar8->score) {
          pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),(long)iVar4);
          lVar1 = pvVar8->last_flip_step;
          pvVar8 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),(long)local_28);
          iVar2 = local_28;
          if (lVar1 < pvVar8->last_flip_step) {
            iVar2 = iVar4;
          }
        }
      }
      local_28 = iVar2;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int ls_solver::pick_var()
{
    size_t i;
    int k, c, v;
    int best_var = 0;

    // if(_random_gen.nextClosed() < _prob_p){
    // 	c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
    // 	clause * cp = &(_clauses[c]);
    // 	return cp->literals[_random_gen.next(cp->literals.size())].var_num;
    // }


    if (_ccd_vars.size() > 0) {
        _mems += _ccd_vars.size();
        best_var = _ccd_vars[0];
        for (int v : _ccd_vars) {
            if (_vars[v].score > _vars[best_var].score) {
                best_var = v;
            } else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step) {
                best_var = v;
            }
        }
        return best_var;
    }

    // Aspriation Mode

    //----------------------------------------
    if (_aspiration_active) {
        // if(_random_gen.nextClosed() < _prob_p){
        // 	c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
        // 	clause * cp = &(_clauses[c]);
        // 	return cp->literals[_random_gen.next(cp->literals.size())].var_num;
        // }

        _aspiration_score = _avg_clause_weight;
        for (i = 0; i < _unsat_vars.size(); ++i) {
            v = _unsat_vars[i];
            if (_vars[v].score > _aspiration_score) {
                best_var = v;
                break;
            }
        }
        for (++i; i < _unsat_vars.size(); ++i) {
            v = _unsat_vars[i];
            if (_vars[v].score > _vars[best_var].score)
                best_var = v;
            else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step)
                best_var = v;
        }
        if (best_var != 0) return best_var;
    }
    //=========================================


    /**Diversification Mode**/
    update_clause_weights();

    /*focused random walk*/
    c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
    clause *cp = &(_clauses[c]);
    best_var = cp->literals[0].var_num;
    int cp_lits_sz = cp->literals.size();
    for (k = 1; k < cp_lits_sz; k++) {
        v = cp->literals[k].var_num;
        if (_vars[v].score > _vars[best_var].score) {
            best_var = v;
        } else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step) {
            best_var = v;
        }
    }
    return best_var;
}